

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChronoFPSLimiterTests.cpp
# Opt level: O0

void __thiscall
solitaire::ChronoFPSLimiterTests_sleepRestOfFrameTimeSavedDuringConstruction_Test::TestBody
          (ChronoFPSLimiterTests_sleepRestOfFrameTimeSavedDuringConstruction_Test *this)

{
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  ChronoFPSLimiter fpsLimiter;
  Milliseconds stop;
  ChronoFPSLimiterTests_sleepRestOfFrameTimeSavedDuringConstruction_Test *this_local;
  
  fpsLimiter.frameStartTime.__d.__r._4_4_ = 5;
  ChronoFPSLimiterTests::expectGetActualTime(&this->super_ChronoFPSLimiterTests,3);
  mock_ptr<solitaire::time::StdTimeFunctionsWrapperMock>::make_unique
            ((mock_ptr<solitaire::time::StdTimeFunctionsWrapperMock> *)local_48);
  std::
  unique_ptr<solitaire::time::interfaces::StdTimeFunctionsWrapper,std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>>
  ::
  unique_ptr<solitaire::time::StdTimeFunctionsWrapperMock,std::default_delete<solitaire::time::StdTimeFunctionsWrapperMock>,void>
            ((unique_ptr<solitaire::time::interfaces::StdTimeFunctionsWrapper,std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>>
              *)(local_48 + 8),
             (unique_ptr<solitaire::time::StdTimeFunctionsWrapperMock,_std::default_delete<solitaire::time::StdTimeFunctionsWrapperMock>_>
              *)local_48);
  time::ChronoFPSLimiter::ChronoFPSLimiter
            ((ChronoFPSLimiter *)local_38,0x3c,
             (unique_ptr<solitaire::time::interfaces::StdTimeFunctionsWrapper,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
              *)(local_48 + 8));
  std::
  unique_ptr<solitaire::time::interfaces::StdTimeFunctionsWrapper,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
  ::~unique_ptr((unique_ptr<solitaire::time::interfaces::StdTimeFunctionsWrapper,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
                 *)(local_48 + 8));
  std::
  unique_ptr<solitaire::time::StdTimeFunctionsWrapperMock,_std::default_delete<solitaire::time::StdTimeFunctionsWrapperMock>_>
  ::~unique_ptr((unique_ptr<solitaire::time::StdTimeFunctionsWrapperMock,_std::default_delete<solitaire::time::StdTimeFunctionsWrapperMock>_>
                 *)local_48);
  ChronoFPSLimiterTests::expectGetActualTime(&this->super_ChronoFPSLimiterTests,5);
  ChronoFPSLimiterTests::expectSleepForCalculatedRestOfTime(&this->super_ChronoFPSLimiterTests,3,5);
  time::ChronoFPSLimiter::sleepRestOfFrameTime((ChronoFPSLimiter *)local_38);
  time::ChronoFPSLimiter::~ChronoFPSLimiter((ChronoFPSLimiter *)local_38);
  return;
}

Assistant:

TEST_F(ChronoFPSLimiterTests, sleepRestOfFrameTimeSavedDuringConstruction) {
    constexpr Milliseconds stop {5};

    expectGetActualTime(start);
    ChronoFPSLimiter fpsLimiter {fps, stdTimeFunctionsWrapperMock.make_unique()};

    expectGetActualTime(stop);
    expectSleepForCalculatedRestOfTime(start, stop);
    fpsLimiter.sleepRestOfFrameTime();
}